

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall
btMultiBody::solveImatrix(btMultiBody *this,btVector3 *rhs_top,btVector3 *rhs_bot,float *result)

{
  btVector3 bVar1;
  btVector3 bVar2;
  btVector3 bVar3;
  btVector3 bVar4;
  btMatrix3x3 invI_lower_right;
  btMatrix3x3 invI_upper_left;
  btMatrix3x3 tmp;
  btMatrix3x3 invI_lower_left;
  btMatrix3x3 invIupper_right;
  float local_1c8;
  float fStack_1c4;
  float local_1b8;
  float local_198;
  float fStack_194;
  float local_178;
  float fStack_174;
  btMatrix3x3 local_158;
  btMatrix3x3 local_128;
  btMatrix3x3 local_f8;
  btMatrix3x3 local_c0;
  btMatrix3x3 local_90;
  btMatrix3x3 local_60;
  
  if ((this->m_links).m_size == 0) {
    *result = rhs_bot->m_floats[0] / (this->m_baseInertia).m_floats[0];
    result[1] = rhs_bot->m_floats[1] / (this->m_baseInertia).m_floats[1];
    result[2] = rhs_bot->m_floats[2] / (this->m_baseInertia).m_floats[2];
    result[3] = rhs_top->m_floats[0] / this->m_baseMass;
    result[4] = rhs_top->m_floats[1] / this->m_baseMass;
    local_1b8 = rhs_top->m_floats[2] / this->m_baseMass;
  }
  else {
    btMatrix3x3::inverse(&this->m_cachedInertiaTopRight);
    local_90.m_el[0].m_floats[2] = -local_f8.m_el[0].m_floats[2];
    local_90.m_el[1].m_floats[2] = -local_f8.m_el[1].m_floats[2];
    local_90.m_el[0].m_floats._0_8_ = local_f8.m_el[0].m_floats._0_8_ ^ 0x8000000080000000;
    local_90.m_el[0].m_floats[3] = 0.0;
    local_90.m_el[2].m_floats[2] = -local_f8.m_el[2].m_floats[2];
    local_90.m_el[1].m_floats._0_8_ = local_f8.m_el[1].m_floats._0_8_ ^ 0x8000000080000000;
    local_90.m_el[1].m_floats[3] = 0.0;
    local_90.m_el[2].m_floats._0_8_ = local_f8.m_el[2].m_floats._0_8_ ^ 0x8000000080000000;
    local_90.m_el[2].m_floats[3] = 0.0;
    operator*(&local_f8,&this->m_cachedInertiaLowerRight,&local_90);
    operator*(&local_158,&local_f8,&this->m_cachedInertiaTopLeft);
    operator+(&local_158,&this->m_cachedInertiaLowerLeft);
    btMatrix3x3::inverse(&local_128);
    operator*(&local_128,&local_60,&this->m_cachedInertiaLowerRight);
    local_f8.m_el[0].m_floats[0] = local_128.m_el[0].m_floats[0];
    local_f8.m_el[0].m_floats[1] = local_128.m_el[0].m_floats[1];
    local_f8.m_el[0].m_floats[2] = local_128.m_el[0].m_floats[2];
    local_f8.m_el[0].m_floats[3] = local_128.m_el[0].m_floats[3];
    local_f8.m_el[1].m_floats[0] = local_128.m_el[1].m_floats[0];
    local_f8.m_el[1].m_floats[1] = local_128.m_el[1].m_floats[1];
    local_f8.m_el[1].m_floats[2] = local_128.m_el[1].m_floats[2];
    local_f8.m_el[1].m_floats[3] = local_128.m_el[1].m_floats[3];
    local_f8.m_el[2].m_floats[0] = local_128.m_el[2].m_floats[0];
    local_f8.m_el[2].m_floats[1] = local_128.m_el[2].m_floats[1];
    local_f8.m_el[2].m_floats[2] = local_128.m_el[2].m_floats[2];
    local_f8.m_el[2].m_floats[3] = local_128.m_el[2].m_floats[3];
    operator*(&local_128,&local_f8,&local_90);
    btMatrix3x3::transpose(&local_158,&local_128);
    operator*(&local_c0,&this->m_cachedInertiaTopLeft,&local_128);
    local_f8.m_el[0].m_floats[2] = local_c0.m_el[0].m_floats[2];
    local_f8.m_el[0].m_floats[3] = local_c0.m_el[0].m_floats[3];
    local_f8.m_el[1].m_floats[2] = local_c0.m_el[1].m_floats[2];
    local_f8.m_el[1].m_floats[3] = local_c0.m_el[1].m_floats[3];
    local_f8.m_el[2].m_floats[0] = local_c0.m_el[2].m_floats[0];
    local_f8.m_el[2].m_floats[1] = local_c0.m_el[2].m_floats[1];
    local_f8.m_el[0].m_floats[0] = local_c0.m_el[0].m_floats[0];
    local_f8.m_el[0].m_floats[1] = local_c0.m_el[0].m_floats[1];
    local_f8.m_el[0].m_floats[0] = local_f8.m_el[0].m_floats[0] + -1.0;
    local_f8.m_el[1].m_floats[1] = local_c0.m_el[1].m_floats[1];
    local_f8.m_el[1].m_floats[0] = local_c0.m_el[1].m_floats[0];
    local_f8.m_el[1].m_floats[1] = local_f8.m_el[1].m_floats[1] + -1.0;
    local_f8.m_el[2].m_floats[2] = local_c0.m_el[2].m_floats[2];
    local_f8.m_el[2].m_floats[3] = local_c0.m_el[2].m_floats[3];
    local_f8.m_el[2].m_floats[2] = local_f8.m_el[2].m_floats[2] + -1.0;
    operator*(&local_c0,&local_90,&local_f8);
    bVar1 = operator*(&local_128,rhs_top);
    bVar2 = operator*(&local_60,rhs_bot);
    bVar3 = operator*(&local_c0,rhs_top);
    bVar4 = operator*(&local_158,rhs_bot);
    local_198 = bVar3.m_floats[0];
    fStack_194 = bVar3.m_floats[1];
    local_1b8 = bVar3.m_floats[2];
    local_1b8 = bVar4.m_floats[2] + local_1b8;
    local_1c8 = bVar1.m_floats[0];
    fStack_1c4 = bVar1.m_floats[1];
    local_178 = bVar2.m_floats[0];
    fStack_174 = bVar2.m_floats[1];
    *result = local_178 + local_1c8;
    result[1] = fStack_174 + fStack_1c4;
    result[2] = bVar2.m_floats[2] + bVar1.m_floats[2];
    result[3] = bVar4.m_floats[0] + local_198;
    result[4] = fStack_194 + bVar4.m_floats[1];
  }
  result[5] = local_1b8;
  return;
}

Assistant:

void btMultiBody::solveImatrix(const btVector3& rhs_top, const btVector3& rhs_bot, float result[6]) const
{
	int num_links = getNumLinks();
	///solve I * x = rhs, so the result = invI * rhs
    if (num_links == 0) 
	{
		// in the case of 0 m_links (i.e. a plain rigid body, not a multibody) rhs * invI is easier
        result[0] = rhs_bot[0] / m_baseInertia[0];
        result[1] = rhs_bot[1] / m_baseInertia[1];
        result[2] = rhs_bot[2] / m_baseInertia[2];
        result[3] = rhs_top[0] / m_baseMass;
        result[4] = rhs_top[1] / m_baseMass;
        result[5] = rhs_top[2] / m_baseMass;
    } else 
	{
		/// Special routine for calculating the inverse of a spatial inertia matrix
		///the 6x6 matrix is stored as 4 blocks of 3x3 matrices
		btMatrix3x3 Binv = m_cachedInertiaTopRight.inverse()*-1.f;
		btMatrix3x3 tmp = m_cachedInertiaLowerRight * Binv;
		btMatrix3x3 invIupper_right = (tmp * m_cachedInertiaTopLeft + m_cachedInertiaLowerLeft).inverse();
		tmp = invIupper_right * m_cachedInertiaLowerRight;
		btMatrix3x3 invI_upper_left = (tmp * Binv);
		btMatrix3x3 invI_lower_right = (invI_upper_left).transpose();
		tmp = m_cachedInertiaTopLeft  * invI_upper_left;
		tmp[0][0]-= 1.0;
		tmp[1][1]-= 1.0;
		tmp[2][2]-= 1.0;
		btMatrix3x3 invI_lower_left = (Binv * tmp);

		//multiply result = invI * rhs
		{
		  btVector3 vtop = invI_upper_left*rhs_top;
		  btVector3 tmp;
		  tmp = invIupper_right * rhs_bot;
		  vtop += tmp;
		  btVector3 vbot = invI_lower_left*rhs_top;
		  tmp = invI_lower_right * rhs_bot;
		  vbot += tmp;
		  result[0] = vtop[0];
		  result[1] = vtop[1];
		  result[2] = vtop[2];
		  result[3] = vbot[0];
		  result[4] = vbot[1];
		  result[5] = vbot[2];
		}
		
    }
}